

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_blob(sqlite3_context *pCtx,void *z,int n,_func_void_void_ptr *xDel)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  sqlite3_context *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  setResultStrOrError(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(u8)((ulong)in_RSI >> 0x18),
                      (_func_void_void_ptr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

SQLITE_API void sqlite3_result_blob(
  sqlite3_context *pCtx,
  const void *z,
  int n,
  void (*xDel)(void *)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 || n<0 ){
    invokeValueDestructor(z, xDel, pCtx);
    return;
  }
#endif
  assert( n>=0 );
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  setResultStrOrError(pCtx, z, n, 0, xDel);
}